

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cProgramInterfaceQueryTests.cpp
# Opt level: O1

long __thiscall gl4cts::anon_unknown_0::OutputLocationIndex::Run(OutputLocationIndex *this)

{
  CallLogWrapper *this_00;
  GLenum *pGVar1;
  undefined8 src_vs;
  GLuint program;
  long error;
  GLenum props [12];
  GLint expected [12];
  
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x16])(props,this);
  src_vs = props._0_8_;
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x17])(expected,this);
  program = PIQBase::CreateProgram((PIQBase *)this,(char *)src_vs,(char *)expected._0_8_,false);
  if ((GLint *)expected._0_8_ != expected + 4) {
    operator_delete((void *)expected._0_8_,expected._16_8_ + 1);
  }
  pGVar1 = props + 4;
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  this_00 = &(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glBindAttribLocation(this_00,program,0,"position");
  glu::CallLogWrapper::glBindFragDataLocationIndexed(this_00,program,0,1,"color");
  PIQBase::LinkProgram((PIQBase *)this,program);
  error = 0;
  props._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props,"color","");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x11])(this,(ulong)program,0x92e4,props,0,&error);
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  props._0_8_ = pGVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)props,"color","");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x14])(this,(ulong)program,0x92e4,props,1,&error);
  if ((GLenum *)props._0_8_ != pGVar1) {
    operator_delete((void *)props._0_8_,props._16_8_ + 1);
  }
  props[8] = 0x9306;
  props[9] = 0x930e;
  props[10] = 0x92e7;
  props[0xb] = 0x930f;
  props[4] = 0x930a;
  props[5] = 0x9309;
  props[6] = 0x9307;
  props[7] = 0x9308;
  props[0] = 0x92f9;
  props[1] = 0x92fa;
  props[2] = 0x92fb;
  props[3] = 0x930b;
  expected[6] = 0;
  expected[7] = 0;
  expected[8] = 0;
  expected[9] = 0;
  expected[0] = 6;
  expected[1] = 0x8b52;
  expected[2] = 1;
  expected[3] = 0;
  expected[4] = 1;
  expected[5] = 0;
  expected[10] = 0;
  expected[0xb] = 1;
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x13])(this,(ulong)program,0x92e4,0,0xc,props,0xc,expected,&error);
  glu::CallLogWrapper::glDeleteProgram(this_00,program);
  return error;
}

Assistant:

virtual long Run()
	{
		GLuint program = CreateProgram(VertexShader().c_str(), FragmentShader().c_str(), false);
		glBindAttribLocation(program, 0, "position");
		glBindFragDataLocationIndexed(program, 0, 1, "color");
		LinkProgram(program);

		long error = NO_ERROR;

		VerifyGetProgramResourceLocation(program, GL_PROGRAM_OUTPUT, "color", 0, error);

		VerifyGetProgramResourceLocationIndex(program, GL_PROGRAM_OUTPUT, "color", 1, error);

		GLenum props[] = { GL_NAME_LENGTH,
						   GL_TYPE,
						   GL_ARRAY_SIZE,
						   GL_REFERENCED_BY_COMPUTE_SHADER,
						   GL_REFERENCED_BY_FRAGMENT_SHADER,
						   GL_REFERENCED_BY_GEOMETRY_SHADER,
						   GL_REFERENCED_BY_TESS_CONTROL_SHADER,
						   GL_REFERENCED_BY_TESS_EVALUATION_SHADER,
						   GL_REFERENCED_BY_VERTEX_SHADER,
						   GL_LOCATION,
						   GL_IS_PER_PATCH,
						   GL_LOCATION_INDEX };
		GLint expected[] = { 6, GL_FLOAT_VEC4, 1, 0, 1, 0, 0, 0, 0, 0, 0, 1 };
		VerifyGetProgramResourceiv(program, GL_PROGRAM_OUTPUT, 0, 12, props, 12, expected, error);

		glDeleteProgram(program);
		return error;
	}